

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldConvertors.h
# Opt level: O2

string * __thiscall
FIX::IntConvertor::convert_abi_cxx11_
          (string *__return_storage_ptr__,IntConvertor *this,signed_int value)

{
  char *pcVar1;
  char buffer [11];
  
  pcVar1 = integer_to_string(buffer,0xb,(signed_int)this);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,pcVar1,&stack0xfffffffffffffff8);
  return __return_storage_ptr__;
}

Assistant:

static std::string convert( signed_int value )
  {
    // buffer is big enough for significant digits and extra digit,
    // minus and null
    char buffer[std::numeric_limits<signed_int>::digits10 + 2];
    const char* const start
      = integer_to_string( buffer, sizeof (buffer), value );
    return std::string( start, buffer + sizeof (buffer) - start );
  }